

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O0

ktx_error_code_e ktxPrintKTX2InfoTextForStream(ktxStream *stream)

{
  ktx_error_code_e kVar1;
  int iVar2;
  KTX_header2 *in_RDI;
  ktx_error_code_e result;
  KTX_header2 header;
  ktx_uint8_t ktx2_ident_ref [12];
  undefined1 local_70 [12];
  undefined1 auStackY_64 [72];
  undefined8 local_1c;
  undefined4 local_14;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_1c = 0xbb30322058544bab;
  local_14 = 0xa1a0a0d;
  if (in_RDI == (KTX_header2 *)0x0) {
    __assert_fail("stream != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/info.c"
                  ,0x46e,"ktx_error_code_e ktxPrintKTX2InfoTextForStream(ktxStream *)");
  }
  kVar1 = (**(code **)in_RDI->identifier)(in_RDI,local_70,0xc);
  if (kVar1 == KTX_SUCCESS) {
    iVar2 = memcmp(local_70,&local_1c,0xc);
    if (iVar2 == 0) {
      kVar1 = (**(code **)in_RDI->identifier)(in_RDI,auStackY_64,0x44);
      if (kVar1 == KTX_SUCCESS) {
        kVar1 = printKTX2Info2((ktxStream *)
                               CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI)
        ;
      }
    }
    else {
      kVar1 = KTX_UNKNOWN_FILE_FORMAT;
    }
  }
  return kVar1;
}

Assistant:

KTX_error_code
ktxPrintKTX2InfoTextForStream(ktxStream* stream)
{
    ktx_uint8_t ktx2_ident_ref[12] = KTX2_IDENTIFIER_REF;
    KTX_header2 header;
    KTX_error_code result;

    assert(stream != NULL);

    result = stream->read(stream, &header, sizeof(ktx2_ident_ref));
    if (result != KTX_SUCCESS)
        return result;

    // Compare identifier, is this a KTX2 file?
    if (memcmp(header.identifier, ktx2_ident_ref, 12))
        return KTX_UNKNOWN_FILE_FORMAT;

    // Read rest of header.
    result = stream->read(stream, &header.vkFormat, KTX2_HEADER_SIZE - sizeof(ktx2_ident_ref));
    if (result != KTX_SUCCESS)
        return result;

    result = printKTX2Info2(stream, &header);
    return result;
}